

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_parser.tab.cc
# Opt level: O0

void __thiscall
MC::MC_Parser::basic_symbol<MC::MC_Parser::by_state>::move
          (basic_symbol<MC::MC_Parser::by_state> *this,basic_symbol<MC::MC_Parser::by_state> *s)

{
  counter_type cVar1;
  symbol_kind_type sVar2;
  basic_symbol<MC::MC_Parser::by_state> *s_local;
  basic_symbol<MC::MC_Parser::by_state> *this_local;
  
  by_state::move(&this->super_by_state,&s->super_by_state);
  sVar2 = by_state::kind(&this->super_by_state);
  if (sVar2 == S_WORD) {
LAB_00199183:
    value_type::move<std::__cxx11::string>(&this->value,&s->value);
  }
  else {
    if (sVar2 != S_COMPARISON) {
      if ((uint)(sVar2 + ~S_COMPARISON) < 3) goto LAB_00199183;
      if (sVar2 != S_INTNUM) {
        if (sVar2 == S_BOOL) {
          value_type::move<bool>(&this->value,&s->value);
          goto LAB_0019919c;
        }
        if (sVar2 == S_APPROXNUM) {
          value_type::move<float>(&this->value,&s->value);
          goto LAB_0019919c;
        }
        if (sVar2 == S_USERVAR) goto LAB_00199183;
        if (((((1 < (uint)(sVar2 + ~S_opt_where)) && (sVar2 != S_table_references)) &&
             (1 < (uint)(sVar2 + ~S_delete_stmt))) &&
            ((sVar2 != S_insert_opts && (sVar2 != S_insert_vals_list)))) &&
           ((sVar2 != S_create_col_list &&
            ((3 < (uint)(sVar2 + ~S_280_1) && (sVar2 != S_data_type)))))) goto LAB_0019919c;
      }
    }
    value_type::move<int>(&this->value,&s->value);
  }
LAB_0019919c:
  (this->location).begin.filename = (s->location).begin.filename;
  cVar1 = (s->location).begin.column;
  (this->location).begin.line = (s->location).begin.line;
  (this->location).begin.column = cVar1;
  (this->location).end.filename = (s->location).end.filename;
  cVar1 = (s->location).end.column;
  (this->location).end.line = (s->location).end.line;
  (this->location).end.column = cVar1;
  return;
}

Assistant:

void
  MC_Parser::basic_symbol<Base>::move (basic_symbol& s)
  {
    super_type::move (s);
    switch (this->kind ())
    {
      case symbol_kind::S_BOOL: // BOOL
        value.move< bool > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_APPROXNUM: // APPROXNUM
        value.move< float > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_COMPARISON: // COMPARISON
      case symbol_kind::S_INTNUM: // INTNUM
      case symbol_kind::S_column_list: // column_list
      case symbol_kind::S_select_expr_list: // select_expr_list
      case symbol_kind::S_table_references: // table_references
      case symbol_kind::S_delete_opts: // delete_opts
      case symbol_kind::S_delete_list: // delete_list
      case symbol_kind::S_insert_opts: // insert_opts
      case symbol_kind::S_insert_vals_list: // insert_vals_list
      case symbol_kind::S_create_col_list: // create_col_list
      case symbol_kind::S_column_atts: // column_atts
      case symbol_kind::S_opt_length: // opt_length
      case symbol_kind::S_opt_binary: // opt_binary
      case symbol_kind::S_opt_uz: // opt_uz
      case symbol_kind::S_data_type: // data_type
        value.move< int > (YY_MOVE (s.value));
        break;

      case symbol_kind::S_WORD: // WORD
      case symbol_kind::S_HLH: // HLH
      case symbol_kind::S_NAME: // NAME
      case symbol_kind::S_STRING: // STRING
      case symbol_kind::S_USERVAR: // USERVAR
        value.move< std::string > (YY_MOVE (s.value));
        break;

      default:
        break;
    }

    location = YY_MOVE (s.location);
  }